

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_18bb43::OneLevel::SetUp(OneLevel *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  hash_function *this_00;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  testing::Test::SetUp((Test *)this);
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"a","");
  this_00 = &this->hash_;
  uVar1 = hash_function::operator()(this_00,(string *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"b","");
  uVar2 = hash_function::operator()(this_00,(string *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"c","");
  uVar3 = hash_function::operator()(this_00,(string *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  local_48 = (undefined1  [8])&local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"d","");
  uVar4 = hash_function::operator()(this_00,(string *)local_48);
  if (local_48 != (undefined1  [8])&local_38) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
  }
  pbVar7 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((uint)uVar1 & 0x3f);
  pbVar9 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((uint)uVar2 & 0x3f);
  local_58._M_head_impl = pbVar9;
  local_50._M_head_impl = pbVar7;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_48,"first_hash & mask","second_hash & mask",
             (unsigned_long *)&local_50,(unsigned_long *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1bd,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  pbVar5 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((uint)uVar3 & 0x3f);
  local_58._M_head_impl = pbVar5;
  local_50._M_head_impl = pbVar7;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_48,"first_hash & mask","third_hash & mask",(unsigned_long *)&local_50
             ,(unsigned_long *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1be,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  pbVar8 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((uint)uVar4 & 0x3f);
  local_58._M_head_impl = pbVar8;
  local_50._M_head_impl = pbVar7;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_48,"first_hash & mask","fourth_hash & mask",
             (unsigned_long *)&local_50,(unsigned_long *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1bf,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_58._M_head_impl = pbVar5;
  local_50._M_head_impl = pbVar9;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_48,"second_hash & mask","third_hash & mask",
             (unsigned_long *)&local_50,(unsigned_long *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1c0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_58._M_head_impl = pbVar8;
  local_50._M_head_impl = pbVar9;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_48,"second_hash & mask","fourth_hash & mask",
             (unsigned_long *)&local_50,(unsigned_long *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1c1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  local_58._M_head_impl = pbVar8;
  local_50._M_head_impl = pbVar5;
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_48,"third_hash & mask","fourth_hash & mask",
             (unsigned_long *)&local_50,(unsigned_long *)&local_58);
  if (local_48[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x1c2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

void SetUp () final {
            GenericIndexFixture::SetUp ();
            // With a known hash function (see map_) and the insertion order below, we should end
            // up with a trie which looks like:
            //
            // root_->bitmap = 0b1000000010001010
            //            +--------+--------+--------+--------+
            // root_ ->   | 000001 | 000011 | 000111 | 001111 |      (hash bits 0-5)
            //            +--------+--------+--------+--------+
            //                |       |          |       |
            //                v       |          |       |
            //               "b"      v          |       |      (0b000001)
            //                       "a"         v       |      (0b000011)
            //                                  "c"      v      (0b000111)
            //                                          "d"     (0b001111)
            std::uint64_t const first_hash = hash_ ("a");
            std::uint64_t const second_hash = hash_ ("b");
            std::uint64_t const third_hash = hash_ ("c");
            std::uint64_t const fourth_hash = hash_ ("d");
            auto const mask = (1U << 6) - 1U;
            EXPECT_NE (first_hash & mask, second_hash & mask);
            EXPECT_NE (first_hash & mask, third_hash & mask);
            EXPECT_NE (first_hash & mask, fourth_hash & mask);
            EXPECT_NE (second_hash & mask, third_hash & mask);
            EXPECT_NE (second_hash & mask, fourth_hash & mask);
            EXPECT_NE (third_hash & mask, fourth_hash & mask);
        }